

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::UnaryAggregateHeap<double,_duckdb::LessThan>::Insert
          (UnaryAggregateHeap<double,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          double *value)

{
  bool bVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  HeapEntry<double> *pHVar6;
  long lVar7;
  double local_50;
  double local_48;
  ulong local_40;
  double *local_38;
  
  pHVar6 = this->heap;
  uVar3 = this->size;
  if (uVar3 < this->capacity) {
    this->size = uVar3 + 1;
    local_50 = *value;
    pHVar6[uVar3].value = local_50;
    if (1 < (long)(uVar3 + 1)) {
      do {
        uVar5 = uVar3 - 1;
        uVar4 = uVar5 >> 1;
        bVar1 = GreaterThan::Operation<double>(&local_50,&pHVar6[uVar4].value);
        if (!bVar1) goto LAB_007d0eb5;
        pHVar6[uVar3].value = pHVar6[uVar4].value;
        uVar3 = uVar4;
      } while (1 < uVar5);
      uVar3 = 0;
    }
LAB_007d0eb5:
    pHVar6[uVar3].value = local_50;
  }
  else {
    bVar1 = GreaterThan::Operation<double>(&pHVar6->value,value);
    if (bVar1) {
      pHVar6 = this->heap;
      iVar2 = this->size;
      if (1 < (long)iVar2) {
        local_48 = pHVar6[iVar2 - 1].value;
        pHVar6[iVar2 - 1].value = pHVar6->value;
        local_40 = iVar2 * 8 - 8;
        lVar7 = (long)local_40 >> 3;
        local_38 = value;
        if (lVar7 < 3) {
          uVar3 = 0;
        }
        else {
          uVar5 = 0;
          do {
            bVar1 = GreaterThan::Operation<double>
                              (&pHVar6[uVar5 * 2 + 1].value,&pHVar6[uVar5 * 2 + 2].value);
            if (bVar1) {
              uVar3 = uVar5 * 2 + 1;
            }
            else {
              uVar3 = uVar5 * 2 + 2;
            }
            pHVar6[uVar5].value = pHVar6[uVar3].value;
            uVar5 = uVar3;
          } while ((long)uVar3 < (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1);
        }
        if (((local_40 & 8) == 0) && (uVar3 == lVar7 + -2 >> 1)) {
          pHVar6[uVar3].value = pHVar6[uVar3 * 2 + 1].value;
          uVar3 = uVar3 * 2 + 1;
        }
        local_50 = local_48;
        if (0 < (long)uVar3) {
          do {
            uVar5 = uVar3 - 1;
            uVar4 = uVar5 >> 1;
            bVar1 = GreaterThan::Operation<double>(&local_50,&pHVar6[uVar4].value);
            if (!bVar1) goto LAB_007d0f48;
            pHVar6[uVar3].value = pHVar6[uVar4].value;
            uVar3 = uVar4;
          } while (1 < uVar5);
          uVar3 = 0;
        }
LAB_007d0f48:
        pHVar6[uVar3].value = local_50;
        pHVar6 = this->heap;
        iVar2 = this->size;
        value = local_38;
      }
      local_50 = *value;
      pHVar6[iVar2 - 1].value = local_50;
      lVar7 = (long)(iVar2 << 3) >> 3;
      uVar3 = lVar7 - 1;
      if (1 < lVar7) {
        do {
          uVar5 = uVar3 - 1;
          uVar4 = uVar5 >> 1;
          bVar1 = GreaterThan::Operation<double>(&local_50,&pHVar6[uVar4].value);
          if (!bVar1) goto LAB_007d0fc6;
          pHVar6[uVar3].value = pHVar6[uVar4].value;
          uVar3 = uVar4;
        } while (1 < uVar5);
        uVar3 = 0;
      }
LAB_007d0fc6:
      pHVar6[uVar3].value = local_50;
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}